

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ellswift_encode
              (secp256k1_context *ctx,uchar *ell64,secp256k1_pubkey *pubkey,uchar *rnd32)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  void *in_RSI;
  secp256k1_sha256 hash;
  int ser_ret;
  size_t ser_size;
  uchar p64 [64];
  secp256k1_fe t;
  secp256k1_ge p;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  undefined1 uVar2;
  secp256k1_ge *in_stack_fffffffffffffea0;
  secp256k1_ge *in_stack_fffffffffffffea8;
  secp256k1_sha256 *in_stack_fffffffffffffeb0;
  secp256k1_pubkey *in_stack_fffffffffffffed8;
  secp256k1_ge *in_stack_fffffffffffffee0;
  secp256k1_context *in_stack_fffffffffffffee8;
  long local_f0;
  undefined1 local_e8 [64];
  secp256k1_fe local_a8 [3];
  void *local_18;
  int local_4;
  
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffea0,
               (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffea0,
               (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffea0,
               (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    iVar1 = secp256k1_pubkey_load
                      (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8
                      );
    if (iVar1 == 0) {
      memset(local_18,0,0x40);
      local_4 = 0;
    }
    else {
      memset(local_e8,0,0x40);
      secp256k1_ellswift_sha256_init_encode((secp256k1_sha256 *)0x1092a9);
      iVar1 = secp256k1_eckey_pubkey_serialize
                        (in_stack_fffffffffffffea8,(uchar *)in_stack_fffffffffffffea0,
                         (size_t *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),0);
      uVar2 = iVar1 != 0 && local_f0 == 0x21;
      secp256k1_sha256_write
                (in_stack_fffffffffffffeb0,(uchar *)in_stack_fffffffffffffea8,
                 (size_t)in_stack_fffffffffffffea0);
      secp256k1_sha256_write
                (in_stack_fffffffffffffeb0,(uchar *)in_stack_fffffffffffffea8,
                 (size_t)in_stack_fffffffffffffea0);
      secp256k1_ellswift_elligatorswift_var
                ((uchar *)in_stack_fffffffffffffeb0,&in_stack_fffffffffffffea8->x,
                 in_stack_fffffffffffffea0,
                 (secp256k1_sha256 *)CONCAT17(uVar2,in_stack_fffffffffffffe98));
      secp256k1_fe_impl_get_b32((uchar *)((long)local_18 + 0x20),local_a8);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_ellswift_encode(const secp256k1_context *ctx, unsigned char *ell64, const secp256k1_pubkey *pubkey, const unsigned char *rnd32) {
    secp256k1_ge p;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(ell64 != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(rnd32 != NULL);

    if (secp256k1_pubkey_load(ctx, &p, pubkey)) {
        secp256k1_fe t;
        unsigned char p64[64] = {0};
        size_t ser_size;
        int ser_ret;
        secp256k1_sha256 hash;

        /* Set up hasher state; the used RNG is H(pubkey || "\x00"*31 || rnd32 || cnt++), using
         * BIP340 tagged hash with tag "secp256k1_ellswift_encode". */
        secp256k1_ellswift_sha256_init_encode(&hash);
        ser_ret = secp256k1_eckey_pubkey_serialize(&p, p64, &ser_size, 1);
        VERIFY_CHECK(ser_ret && ser_size == 33);
        secp256k1_sha256_write(&hash, p64, sizeof(p64));
        secp256k1_sha256_write(&hash, rnd32, 32);

        /* Compute ElligatorSwift encoding and construct output. */
        secp256k1_ellswift_elligatorswift_var(ell64, &t, &p, &hash); /* puts u in ell64[0..32] */
        secp256k1_fe_get_b32(ell64 + 32, &t); /* puts t in ell64[32..64] */
        return 1;
    }
    /* Only reached in case the provided pubkey is invalid. */
    memset(ell64, 0, 64);
    return 0;
}